

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
AdapterPromiseNode<capnp::AnyPointer::Pipeline,_kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>_>
::fulfill(AdapterPromiseNode<capnp::AnyPointer::Pipeline,_kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>_>
          *this,Pipeline *value)

{
  ExceptionOr<capnp::AnyPointer::Pipeline> EStack_1d8;
  
  if (this->waiting == true) {
    this->waiting = false;
    ExceptionOr<capnp::AnyPointer::Pipeline>::ExceptionOr(&EStack_1d8,value);
    ExceptionOr<capnp::AnyPointer::Pipeline>::operator=(&this->result,&EStack_1d8);
    ExceptionOr<capnp::AnyPointer::Pipeline>::~ExceptionOr(&EStack_1d8);
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }